

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<int>::test_vectordivide_numerators<(libdivide::Branching)1>
          (DivideTest<int> *this,int denom,divider<int,_(libdivide::Branching)1> *the_divider)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  size_t i;
  long lVar5;
  bool bVar6;
  char mem [128];
  uint local_80 [20];
  
  lVar5 = 0;
  do {
    uVar1 = this->seed;
    uVar2 = this->rand_n;
    lVar3 = 0;
    do {
      uVar1 = uVar1 * 0x19660d + 0x3c6ef35f;
      uVar4 = ((uVar1 & 1) + 1) * uVar2 + 3 + uVar2 % 0x1c9c381;
      bVar6 = uVar2 <= uVar4;
      uVar2 = uVar1 % 0x13;
      if (bVar6) {
        uVar2 = uVar4;
      }
      uVar4 = -uVar2;
      if ((uVar1 & 1) == 0) {
        uVar4 = uVar2;
      }
      local_80[lVar3] = uVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    this->seed = uVar1;
    this->rand_n = uVar2;
    test_vec<long_long__vector(2),(libdivide::Branching)1>
              (this,(int *)local_80,0x10,denom,the_divider);
    test_vec<long_long__vector(4),(libdivide::Branching)1>
              (this,(int *)local_80,0x10,denom,the_divider);
    test_vec<long_long__vector(8),(libdivide::Branching)1>
              (this,(int *)local_80,0x10,denom,the_divider);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10000);
  return;
}

Assistant:

void test_vectordivide_numerators(T denom, const divider<T, ALGO> &the_divider) {
#if defined(VECTOR_TESTS)
        // Align memory to 64 byte boundary for AVX512
        char mem[min_vector_count * sizeof(T) + 64];
        size_t offset = 64 - (size_t)&mem % 64;
        T *numers = (T *)&mem[offset];

        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                numers[j] = get_random();
            }
#ifdef LIBDIVIDE_SSE2
            test_vec<__m128i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX2
            test_vec<__m256i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX512
            test_vec<__m512i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_NEON
            test_vec<typename NeonVecFor<T>::type>(numers, min_vector_count, denom, the_divider);
#endif
        }
#else
        UNUSED(denom);
        UNUSED(the_divider);
#endif
    }